

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall kj::Vector<kj::StringPtr>::setCapacity(Vector<kj::StringPtr> *this,size_t newSize)

{
  StringPtr *pSVar1;
  RemoveConst<kj::StringPtr> *pRVar2;
  StringPtr *pSVar3;
  size_t __n;
  ArrayBuilder<kj::StringPtr> local_38;
  
  pSVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pSVar1 >> 4)) {
    (this->builder).pos = pSVar1 + newSize;
  }
  pSVar3 = (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = pSVar3 + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pSVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pSVar1;
  local_38.ptr = pSVar3;
  if (__n != 0) {
    memcpy(pSVar3,pSVar1,__n);
  }
  local_38.pos = (RemoveConst<kj::StringPtr> *)((long)pSVar3 + __n);
  ArrayBuilder<kj::StringPtr>::operator=(&this->builder,&local_38);
  pSVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pSVar1 = local_38.ptr;
  if (local_38.ptr != (StringPtr *)0x0) {
    local_38.ptr = (StringPtr *)0x0;
    local_38.pos = (RemoveConst<kj::StringPtr> *)0x0;
    local_38.endPtr = (StringPtr *)0x0;
    (*(code *)**(undefined8 **)local_38.disposer)
              (local_38.disposer,pSVar1,0x10,(long)pRVar2 - (long)pSVar1 >> 4,
               (long)pSVar3 - (long)pSVar1 >> 4,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }